

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::RepeatedMessageFieldGenerator::DetermineForwardDeclarations
          (RepeatedMessageFieldGenerator *this,
          btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *fwd_decls,bool include_external_types)

{
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  *this_00;
  bool bVar1;
  Descriptor *pDVar2;
  FileDescriptor *pFVar3;
  FileDescriptor *pFVar4;
  AlphaNum *in_R8;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_bool>
  local_128;
  AlphaNum local_110;
  string_view local_d0;
  string local_c0;
  AlphaNum local_a0;
  AlphaNum local_70;
  string local_40;
  byte local_19;
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  *pbStack_18;
  bool include_external_types_local;
  btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *fwd_decls_local;
  RepeatedMessageFieldGenerator *this_local;
  
  local_19 = include_external_types;
  pbStack_18 = &fwd_decls->
                super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  ;
  fwd_decls_local =
       (btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  FieldGenerator::DetermineForwardDeclarations
            ((FieldGenerator *)this,fwd_decls,include_external_types);
  if ((local_19 & 1) != 0) {
    pDVar2 = FieldDescriptor::message_type
                       ((this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                        super_SingleFieldGenerator.super_FieldGenerator.descriptor_);
    pFVar3 = Descriptor::file(pDVar2);
    bVar1 = IsProtobufLibraryBundledProtoFile(pFVar3);
    if (!bVar1) goto LAB_00577157;
  }
  pFVar3 = FieldDescriptor::file
                     ((this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                      super_SingleFieldGenerator.super_FieldGenerator.descriptor_);
  pDVar2 = FieldDescriptor::message_type
                     ((this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                      super_SingleFieldGenerator.super_FieldGenerator.descriptor_);
  pFVar4 = Descriptor::file(pDVar2);
  if (pFVar3 != pFVar4) {
    return;
  }
LAB_00577157:
  this_00 = pbStack_18;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_70,"@class ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"msg_type");
  FieldGenerator::variable_abi_cxx11_(&local_c0,(FieldGenerator *)this,local_d0);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_a0,&local_c0);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_110,";");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_40,(lts_20250127 *)&local_70,&local_a0,&local_110,in_R8);
  absl::lts_20250127::container_internal::
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  ::insert(&local_128,this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::DetermineForwardDeclarations(
    absl::btree_set<std::string>* fwd_decls,
    bool include_external_types) const {
  RepeatedFieldGenerator::DetermineForwardDeclarations(fwd_decls,
                                                       include_external_types);
  // Within a file there is no requirement on the order of the messages, so
  // local references need a forward declaration. External files (not WKTs),
  // need one when requested.
  if ((include_external_types && !IsProtobufLibraryBundledProtoFile(
                                     descriptor_->message_type()->file())) ||
      descriptor_->file() == descriptor_->message_type()->file()) {
    fwd_decls->insert(absl::StrCat("@class ", variable("msg_type"), ";"));
  }
}